

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

void sysbvm_tuple_byteSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,uint8_t value)

{
  _Bool _Var1;
  bool bVar2;
  
  bVar2 = (tuple & 0xf) != 0;
  if (bVar2 || tuple == 0) {
    sysbvm_error_modifyImmediateValue();
  }
  _Var1 = sysbvm_tuple_isDummyValue(tuple);
  if (_Var1) {
    sysbvm_error_accessDummyValue();
  }
  if ((tuple & 0xf) != 0) {
    sysbvm_error_modifyImmutableTuple();
  }
  _Var1 = sysbvm_tuple_isBytes(tuple);
  if (!_Var1) {
    sysbvm_error("Expected a byte tuple.");
  }
  if ((!bVar2 && tuple != 0) && (slotIndex < *(uint *)(tuple + 0xc))) {
    *(uint8_t *)(tuple + 0x10 + slotIndex) = value;
    return;
  }
  sysbvm_error_outOfBoundsSlotAccess();
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_byteSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, uint8_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(!sysbvm_tuple_isBytes(tuple))
        sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = value;
    else
        sysbvm_error_outOfBoundsSlotAccess();
}